

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clump.cpp
# Opt level: O1

Atomic * rw::Atomic::streamReadClump(Stream *stream,FrameList_ *frameList,Geometry **geometryList)

{
  uint8 *puVar1;
  bool bVar2;
  Atomic *this;
  Geometry *geo;
  uint32 version;
  int32 buf [4];
  uint local_3c;
  int local_38;
  int local_34;
  uint8 local_30;
  
  bVar2 = findChunk(stream,1,(uint32 *)0x0,&local_3c);
  if (!bVar2) {
    streamReadClump();
    return (Atomic *)0x0;
  }
  Stream::read32(stream,&local_38,(uint)(0x303ff < local_3c) * 4 + 0xc);
  this = create();
  if (this == (Atomic *)0x0) {
    return (Atomic *)0x0;
  }
  ObjectWithFrame::setFrame(&this->object,frameList->frames[local_38]);
  puVar1 = &(this->object).object.privateFlags;
  *puVar1 = *puVar1 | 1;
  if (local_3c < 0x30400) {
    bVar2 = findChunk(stream,0xf,(uint32 *)0x0,(uint32 *)0x0);
    if (!bVar2) {
      streamReadClump();
      goto LAB_0012eac6;
    }
    geo = Geometry::streamRead(stream);
    if (geo == (Geometry *)0x0) goto LAB_0012eac6;
    setGeometry(this,geo,0);
    Geometry::destroy(geo);
  }
  else {
    setGeometry(this,geometryList[local_34],0);
  }
  (this->object).object.flags = local_30;
  atomicRights = 0;
  bVar2 = PluginList::streamRead((PluginList *)&s_plglist,stream,this);
  if (bVar2) {
    if (atomicRights != 0) {
      PluginList::assertRights((PluginList *)&s_plglist,this,atomicRights,DAT_0014a1e4);
      return this;
    }
    return this;
  }
LAB_0012eac6:
  destroy(this);
  return (Atomic *)0x0;
}

Assistant:

Atomic*
Atomic::streamReadClump(Stream *stream,
                        FrameList_ *frameList, Geometry **geometryList)
{
	int32 buf[4];
	uint32 version;
	if(!findChunk(stream, ID_STRUCT, nil, &version)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	stream->read32(buf, version < 0x30400 ? 12 : 16);
	Atomic *atomic = Atomic::create();
	if(atomic == nil)
		return nil;
	atomic->setFrame(frameList->frames[buf[0]]);
	Geometry *g;
	if(version < 0x30400){
		if(!findChunk(stream, ID_GEOMETRY, nil, nil)){
			RWERROR((ERR_CHUNK, "STRUCT"));
			goto fail;
		}
		g = Geometry::streamRead(stream);
		if(g == nil)
			goto fail;
		atomic->setGeometry(g, 0);
		g->destroy();
	}else
		atomic->setGeometry(geometryList[buf[1]], 0);
	atomic->object.object.flags = buf[2];

	atomicRights[0] = 0;
	if(!s_plglist.streamRead(stream, atomic))
		goto fail;
	if(atomicRights[0])
		s_plglist.assertRights(atomic, atomicRights[0], atomicRights[1]);
	return atomic;

fail:
	atomic->destroy();
	return nil;
}